

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int X509V3_NAME_from_section(X509_NAME *nm,stack_st_CONF_VALUE *dn_sk,ulong chtype)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  ulong i;
  char *pcVar7;
  char *pcVar8;
  
  if (nm == (X509_NAME *)0x0) {
    return 0;
  }
  uVar3 = 0;
  do {
    i = uVar3;
    sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)dn_sk);
    if (sVar5 <= i) break;
    pvVar6 = OPENSSL_sk_value((OPENSSL_STACK *)dn_sk,i);
    pcVar7 = *(char **)((long)pvVar6 + 8);
    pcVar2 = pcVar7;
    do {
      pcVar8 = pcVar2 + 1;
      cVar1 = *pcVar2;
      if (cVar1 == '\0') goto LAB_0019d31a;
    } while (((cVar1 != ',') && (cVar1 != ':')) && (pcVar2 = pcVar8, cVar1 != '.'));
    if (*pcVar8 != '\0') {
      pcVar7 = pcVar8;
    }
LAB_0019d31a:
    iVar4 = X509_NAME_add_entry_by_txt
                      (nm,pcVar7 + (*pcVar7 == '+'),(int)chtype,*(uchar **)((long)pvVar6 + 0x10),-1,
                       -1,-(uint)(*pcVar7 == '+'));
    uVar3 = i + 1;
  } while (iVar4 != 0);
  return (int)(sVar5 <= i);
}

Assistant:

int X509V3_NAME_from_section(X509_NAME *nm, const STACK_OF(CONF_VALUE) *dn_sk,
                             int chtype) {
  if (!nm) {
    return 0;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(dn_sk); i++) {
    const CONF_VALUE *v = sk_CONF_VALUE_value(dn_sk, i);
    const char *type = v->name;
    // Skip past any leading X. X: X, etc to allow for multiple instances
    for (const char *p = type; *p; p++) {
      if ((*p == ':') || (*p == ',') || (*p == '.')) {
        p++;
        if (*p) {
          type = p;
        }
        break;
      }
    }
    int mval;
    if (*type == '+') {
      mval = -1;
      type++;
    } else {
      mval = 0;
    }
    if (!X509_NAME_add_entry_by_txt(nm, type, chtype, (unsigned char *)v->value,
                                    -1, -1, mval)) {
      return 0;
    }
  }
  return 1;
}